

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _tree.hpp
# Opt level: O1

void __thiscall
ft::RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>::
treeTerminate(RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
              *this)

{
  operator_delete(this->NIL);
  operator_delete(this->m_first);
  operator_delete(this->m_last);
  return;
}

Assistant:

void treeTerminate() {
		this->m_alloc.destroy(this->NIL);
		this->m_alloc.destroy(this->m_first);
		this->m_alloc.destroy(this->m_last);
		this->m_alloc.deallocate(this->NIL, 1);
		this->m_alloc.deallocate(this->m_first, 1);
		this->m_alloc.deallocate(this->m_last, 1);
	}